

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O0

format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_fmt::v8::basic_string_view<char>,_char[3]>
* __thiscall
fmt::v8::
make_format_args<fmt::v8::basic_format_context<fmt::v8::appender,char>,fmt::v8::basic_string_view<char>&,char_const(&)[3]>
          (format_arg_store<fmt::v8::basic_format_context<fmt::v8::appender,_char>,_fmt::v8::basic_string_view<char>,_char[3]>
           *__return_storage_ptr__,v8 *this,basic_string_view<char> *args,char (*args_1) [3])

{
  size_t sVar1;
  basic_string_view<char> s;
  char (*args_local_1) [3];
  basic_string_view<char> *args_local;
  undefined1 local_119;
  bool formattable;
  bool formattable_pointer;
  bool formattable_const;
  bool formattable_char;
  char *pcStack_118;
  size_t sStack_110;
  undefined1 *local_108;
  basic_string_view<char> *arg;
  char *local_f8 [3];
  bool formattable_1;
  bool formattable_pointer_1;
  bool formattable_const_1;
  bool formattable_char_1;
  char_type **arg_1;
  size_t local_c0;
  v8 *local_78;
  char *pcStack_70;
  v8 *local_60;
  undefined1 *local_58;
  basic_string_view<char> local_50;
  char **local_40;
  basic_string_view<char> local_38 [3];
  
  local_58 = &local_119;
  local_78 = *(v8 **)this;
  pcStack_70 = *(char **)(this + 8);
  s.size_ = (size_t)args;
  s.data_ = pcStack_70;
  arg = (basic_string_view<char> *)this;
  local_60 = this;
  local_50 = to_string_view<char>(local_78,s);
  pcStack_118 = local_50.data_;
  sStack_110 = local_50.size_;
  local_108 = (undefined1 *)&stack0xfffffffffffffee8;
  local_38[0].data_ = local_50.data_;
  local_38[0].size_ = local_50.size_;
  local_40 = local_f8;
  local_f8[0] = basic_string_view<char>::data(local_38);
  sVar1 = basic_string_view<char>::size(local_38);
  (__return_storage_ptr__->data_).args_[0].field_0.string.data = local_f8[0];
  (__return_storage_ptr__->data_).args_[0].field_0.string.size = sVar1;
  (__return_storage_ptr__->data_).args_[1].field_0.named_args.data = (named_arg_info<char> *)args;
  (__return_storage_ptr__->data_).args_[1].field_0.string.size = local_c0;
  return __return_storage_ptr__;
}

Assistant:

constexpr auto make_format_args(Args&&... args)
    -> format_arg_store<Context, remove_cvref_t<Args>...> {
  return {std::forward<Args>(args)...};
}